

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparse.array.c
# Opt level: O2

void pnga_sprs_array_get_diag(Integer s_a,Integer *g_d)

{
  long lVar1;
  undefined8 *puVar2;
  undefined8 *puVar3;
  uint uVar4;
  undefined8 uVar5;
  _sparse_array *p_Var6;
  Integer proc;
  Integer IVar7;
  Integer IVar8;
  long lVar9;
  long lVar10;
  ulong uVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  bool bVar15;
  void *diag;
  ulong local_b8;
  Integer local_b0;
  int local_a8;
  char op [2];
  Integer ihi;
  Integer ilo;
  Integer one;
  Integer local_80;
  Integer *local_78;
  void *vptr;
  int *jptr;
  int *iptr;
  Integer hi;
  Integer lo;
  Integer nproc;
  Integer jhi;
  Integer jlo;
  
  lVar1 = s_a + 1000;
  IVar8 = SPA[lVar1].grp;
  proc = pnga_pgroup_nodeid(IVar8);
  IVar7 = pnga_pgroup_nnodes(IVar8);
  one = 1;
  local_b8 = (ulong)(uint)SPA[lVar1].idx_size;
  bVar15 = _ga_sync_begin != 0;
  local_a8 = _ga_sync_end;
  _ga_sync_begin = 1;
  _ga_sync_end = _ga_sync_begin;
  nproc = IVar7;
  if (bVar15) {
    pnga_pgroup_sync(IVar8);
  }
  local_78 = (Integer *)malloc(IVar7 * 8 + 8);
  for (lVar9 = 0; p_Var6 = SPA, lVar9 <= IVar7; lVar9 = lVar9 + 1) {
    local_78[lVar9] = 0;
  }
  local_78[proc] = SPA[lVar1].ilo + 1;
  if (proc == IVar7 + -1) {
    local_78[proc + 1] = p_Var6[lVar1].ihi + 1;
  }
  op[0] = '+';
  op[1] = '\0';
  local_b0 = s_a;
  local_80 = IVar8;
  pnga_pgroup_gop(IVar8,0x3ea,local_78,IVar7 + 1,op);
  IVar8 = pnga_create_handle();
  *g_d = IVar8;
  pnga_set_data(IVar8,one,&SPA[lVar1].idim,SPA[lVar1].type);
  pnga_set_pgroup(*g_d,SPA[lVar1].grp);
  pnga_set_irreg_distr(*g_d,local_78,&nproc);
  pnga_allocate(*g_d);
  pnga_zero(*g_d);
  pnga_distribution(*g_d,proc,&lo,&hi);
  pnga_access_ptr(*g_d,&lo,&hi,&diag,&one);
  IVar8 = local_b0;
  pnga_sprs_array_row_distribution(local_b0,proc,&ilo,&ihi);
  pnga_sprs_array_column_distribution(IVar8,proc,&jlo,&jhi);
  if ((int)local_b8 == 4) {
    pnga_sprs_array_access_col_block(IVar8,proc,&iptr,&jptr,&vptr);
    local_b0 = ihi;
    local_b8 = ilo;
    IVar8 = ilo;
    while (lVar9 = IVar8, lVar9 <= ihi) {
      lVar12 = lVar9 - ilo;
      uVar4 = iptr[(lVar9 + 1) - ilo] - iptr[lVar12];
      if (iptr[(lVar9 + 1) - ilo] - iptr[lVar12] < 1) {
        uVar4 = 0;
      }
      for (uVar11 = 0; IVar8 = lVar9 + 1, uVar4 != uVar11; uVar11 = uVar11 + 1) {
        lVar13 = (long)iptr[lVar12] + uVar11;
        if (lVar9 == jptr[lVar13]) {
          switch(SPA[lVar1].type) {
          case 0x3e9:
            *(undefined4 *)((long)diag + lVar12 * 4) = *(undefined4 *)((long)vptr + lVar13 * 4);
            break;
          case 0x3ea:
          case 0x3f8:
            *(undefined8 *)((long)diag + lVar12 * 8) = *(undefined8 *)((long)vptr + lVar13 * 8);
            break;
          case 0x3eb:
            *(undefined4 *)((long)diag + lVar12 * 4) = *(undefined4 *)((long)vptr + lVar13 * 4);
            break;
          case 0x3ec:
            *(undefined8 *)((long)diag + lVar12 * 8) = *(undefined8 *)((long)vptr + lVar13 * 8);
            break;
          case 0x3ee:
            *(undefined8 *)((long)diag + lVar12 * 8) = *(undefined8 *)((long)vptr + lVar13 * 8);
            break;
          case 0x3ef:
            puVar2 = (undefined8 *)((long)vptr + lVar13 * 0x10);
            uVar5 = puVar2[1];
            puVar3 = (undefined8 *)((long)diag + lVar12 * 0x10);
            *puVar3 = *puVar2;
            puVar3[1] = uVar5;
          }
        }
      }
    }
  }
  else {
    pnga_sprs_array_access_col_block(IVar8,proc,&iptr,&jptr,&vptr);
    local_b0 = ihi;
    local_b8 = ilo;
    IVar8 = ilo;
    while (lVar9 = IVar8, lVar9 <= ihi) {
      lVar12 = lVar9 - ilo;
      lVar13 = *(long *)(iptr + ((lVar9 + 1) - ilo) * 2) - *(long *)(iptr + lVar12 * 2);
      if (lVar13 < 1) {
        lVar13 = 0;
      }
      for (lVar14 = 0; IVar8 = lVar9 + 1, lVar13 != lVar14; lVar14 = lVar14 + 1) {
        lVar10 = *(long *)(iptr + lVar12 * 2) + lVar14;
        if (lVar9 == *(long *)(jptr + lVar10 * 2)) {
          switch(SPA[lVar1].type) {
          case 0x3e9:
            *(undefined4 *)((long)diag + lVar12 * 4) = *(undefined4 *)((long)vptr + lVar10 * 4);
            break;
          case 0x3ea:
          case 0x3f8:
            *(undefined8 *)((long)diag + lVar12 * 8) = *(undefined8 *)((long)vptr + lVar10 * 8);
            break;
          case 0x3eb:
            *(undefined4 *)((long)diag + lVar12 * 4) = *(undefined4 *)((long)vptr + lVar10 * 4);
            break;
          case 0x3ec:
            *(undefined8 *)((long)diag + lVar12 * 8) = *(undefined8 *)((long)vptr + lVar10 * 8);
            break;
          case 0x3ee:
            *(undefined8 *)((long)diag + lVar12 * 8) = *(undefined8 *)((long)vptr + lVar10 * 8);
            break;
          case 0x3ef:
            puVar2 = (undefined8 *)((long)vptr + lVar10 * 0x10);
            uVar5 = puVar2[1];
            puVar3 = (undefined8 *)((long)diag + lVar12 * 0x10);
            *puVar3 = *puVar2;
            puVar3[1] = uVar5;
          }
        }
      }
    }
  }
  free(local_78);
  pnga_release_update(*g_d,&lo,&hi);
  if (local_a8 != 0) {
    pnga_pgroup_sync(local_80);
  }
  return;
}

Assistant:

void pnga_sprs_array_get_diag(Integer s_a, Integer *g_d)
{
  Integer hdl = GA_OFFSET + s_a;
  int local_sync_begin,local_sync_end;
  Integer *map;
  Integer grp = SPA[hdl].grp;
  Integer me = pnga_pgroup_nodeid(grp);
  Integer nproc = pnga_pgroup_nnodes(grp);
  Integer iproc;
  Integer one = 1;
  Integer lo, hi;
  Integer ilo, ihi, jlo, jhi, ncols;
  int *iptr, *jptr;
  int64_t *ilptr, *jlptr;
  int idx_size = SPA[hdl].idx_size;
  Integer i, j;
  void *diag, *vptr;
  char op[2];


  local_sync_begin = _ga_sync_begin; local_sync_end = _ga_sync_end;
  _ga_sync_begin = 1; _ga_sync_end=1; /*remove any previous masking*/
  if (local_sync_begin) pnga_pgroup_sync(grp);
  /* Get row distribution of matrix */
  map = (Integer*)malloc((nproc+1)*sizeof(Integer));
  for (iproc=0; iproc<nproc+1; iproc++) map[iproc] = 0;
  map[me] = SPA[hdl].ilo+1;
  if (me == nproc-1) map[me+1] = SPA[hdl].ihi+1;
  op[0] = '+';
  op[1] = '\0';
  if (sizeof(Integer) == 4) {
    pnga_pgroup_gop(grp, C_INT, map, nproc+1, op);
  } else {
    pnga_pgroup_gop(grp, C_LONG, map, nproc+1, op);
  }
  /* Create array to hold diagonal */
  *g_d = pnga_create_handle();
  pnga_set_data(*g_d,one,&SPA[hdl].idim,SPA[hdl].type);
  pnga_set_pgroup(*g_d,SPA[hdl].grp);
  pnga_set_irreg_distr(*g_d,map,&nproc);
  pnga_allocate(*g_d);
  /* zero all elements. If diagonal element is not found for a row, then it
   * must be zero */
  pnga_zero(*g_d);
  pnga_distribution(*g_d,me,&lo,&hi);
  pnga_access_ptr(*g_d, &lo, &hi, &diag, &one);
  /* extract diagonal elements */
  pnga_sprs_array_row_distribution(s_a,me,&ilo,&ihi);
  pnga_sprs_array_column_distribution(s_a,me,&jlo,&jhi);
  if (idx_size == 4) {
    pnga_sprs_array_access_col_block(s_a,me,&iptr,&jptr,&vptr);
    for (i=ilo; i<=ihi; i++) {
      ncols = iptr[i+1-ilo]-iptr[i-ilo];
      for (j=0; j<ncols; j++) {
        if (i == jptr[iptr[i-ilo]+j]) {
          if (SPA[hdl].type == C_INT) {
            ((int*)diag)[i-ilo] = ((int*)vptr)[iptr[i-ilo]+j];
          } else if (SPA[hdl].type == C_LONG) {
            ((long*)diag)[i-ilo] = ((long*)vptr)[iptr[i-ilo]+j];
          } else if (SPA[hdl].type == C_LONGLONG) {
            ((long long*)diag)[i-ilo] = ((long long*)vptr)[iptr[i-ilo]+j];
          } else if (SPA[hdl].type == C_FLOAT) {
            ((float*)diag)[i-ilo] = ((float*)vptr)[iptr[i-ilo]+j];
          } else if (SPA[hdl].type == C_DBL) {
            ((double*)diag)[i-ilo] = ((double*)vptr)[iptr[i-ilo]+j];
          } else if (SPA[hdl].type == C_SCPL) {
            ((SingleComplex*)diag)[i-ilo] = ((SingleComplex*)vptr)[iptr[i-ilo]+j];
          } else if (SPA[hdl].type == C_DCPL) {
            ((DoubleComplex*)diag)[i-ilo] = ((DoubleComplex*)vptr)[iptr[i-ilo]+j];
          }
        }
      }
    }
  } else {
    pnga_sprs_array_access_col_block(s_a,me,&ilptr,&jlptr,&vptr);
    for (i=ilo; i<=ihi; i++) {
      ncols = ilptr[i+1-ilo]-ilptr[i-ilo];
      for (j=0; j<ncols; j++) {
        if (i == jlptr[ilptr[i-ilo]+j]) {
          if (SPA[hdl].type == C_INT) {
            ((int*)diag)[i-ilo] = ((int*)vptr)[ilptr[i-ilo]+j];
          } else if (SPA[hdl].type == C_LONG) {
            ((long*)diag)[i-ilo] = ((long*)vptr)[ilptr[i-ilo]+j];
          } else if (SPA[hdl].type == C_LONGLONG) {
            ((long long*)diag)[i-ilo] = ((long long*)vptr)[ilptr[i-ilo]+j];
          } else if (SPA[hdl].type == C_FLOAT) {
            ((float*)diag)[i-ilo] = ((float*)vptr)[ilptr[i-ilo]+j];
          } else if (SPA[hdl].type == C_DBL) {
            ((double*)diag)[i-ilo] = ((double*)vptr)[ilptr[i-ilo]+j];
          } else if (SPA[hdl].type == C_SCPL) {
            ((SingleComplex*)diag)[i-ilo] = ((SingleComplex*)vptr)[ilptr[i-ilo]+j];
          } else if (SPA[hdl].type == C_DCPL) {
            ((DoubleComplex*)diag)[i-ilo] = ((DoubleComplex*)vptr)[ilptr[i-ilo]+j];
          }
        }
      }
    }
  }
  free(map);
  pnga_release_update(*g_d, &lo, &hi);
  if (local_sync_end) pnga_pgroup_sync(grp);
}